

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::addNewDataLocation(Union *this,uint lgSize)

{
  uint uVar1;
  DataLocation local_20;
  
  uVar1 = (*this->parent->_vptr_StructOrGroup[1])();
  local_20.lgSize = lgSize;
  local_20.offset = uVar1;
  kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
  add<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>
            (&this->dataLocations,&local_20);
  return uVar1;
}

Assistant:

uint addNewDataLocation(uint lgSize) {
      // Add a whole new data location to the union with the given size.

      uint offset = parent.addData(lgSize);
      dataLocations.add(DataLocation { lgSize, offset });
      return offset;
    }